

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumbuilder.cpp
# Opt level: O0

EnumBuilder * __thiscall camp::EnumBuilder::value(EnumBuilder *this,string *name,long value)

{
  bool bVar1;
  undefined1 local_48 [8];
  Pair pair;
  long value_local;
  string *name_local;
  EnumBuilder *this_local;
  
  pair.value = value;
  bVar1 = Enum::hasName(this->m_target,name);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_target->hasName(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enumbuilder.cpp"
                  ,0x2f,"EnumBuilder &camp::EnumBuilder::value(const std::string &, long)");
  }
  bVar1 = Enum::hasValue(this->m_target,pair.value);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_target->hasValue(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enumbuilder.cpp"
                  ,0x30,"EnumBuilder &camp::EnumBuilder::value(const std::string &, long)");
  }
  Enum::Pair::Pair((Pair *)local_48);
  std::__cxx11::string::operator=((string *)local_48,(string *)name);
  pair._24_8_ = pair.value;
  boost::multi_index::detail::
  random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
  ::push_back(&(this->m_target->m_pairs).super_type,(value_type *)local_48);
  Enum::Pair::~Pair((Pair *)local_48);
  return this;
}

Assistant:

EnumBuilder& EnumBuilder::value(const std::string& name, long value)
{
    assert(!m_target->hasName(name));
    assert(!m_target->hasValue(value));

    Enum::Pair pair;
    pair.name = name;
    pair.value = value;
    m_target->m_pairs.push_back(pair);

    return *this;
}